

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O0

Box * __thiscall amrex::PCInterp::CoarseBox(PCInterp *this,Box *fine,int ratio)

{
  int in_ECX;
  int iVar1;
  undefined8 *in_RDX;
  Box *in_RDI;
  bool bVar2;
  Box *result;
  int dir;
  IntVect off;
  int local_264;
  int local_260;
  int local_25c;
  int local_254;
  int local_250;
  int local_24c;
  int local_244;
  int local_240;
  int local_23c;
  int local_22c;
  int local_228;
  int local_224;
  int local_21c;
  int local_218;
  int local_214;
  int local_20c;
  int local_208;
  int local_204;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  IntVect local_180 [2];
  int local_168;
  IntVect local_164;
  IntVect *local_158;
  undefined4 local_134;
  IntVect *local_130;
  IntVect *local_108;
  IndexType *local_f8;
  int local_7c;
  int local_78;
  int local_70;
  int local_6c;
  int local_64;
  int local_60;
  int local_54;
  int local_48;
  int local_3c;
  int local_30;
  int local_24;
  int local_18;
  
  *(undefined8 *)(in_RDI->smallend).vect = *in_RDX;
  *(undefined8 *)((in_RDI->smallend).vect + 2) = in_RDX[1];
  *(undefined8 *)((in_RDI->bigend).vect + 1) = in_RDX[2];
  (in_RDI->btype).itype = *(uint *)(in_RDX + 3);
  IntVect::IntVect(local_180,in_ECX);
  local_158 = local_180;
  local_134 = 1;
  bVar2 = true;
  if ((local_180[0].vect[0] == 1) && (bVar2 = true, local_180[0].vect[1] == 1)) {
    bVar2 = local_180[0].vect[2] != 1;
  }
  if (bVar2) {
    local_64 = (in_RDI->smallend).vect[0];
    local_60 = local_64;
    if (local_180[0].vect[0] != 1) {
      if (local_180[0].vect[0] == 2) {
        if (local_64 < 0) {
          iVar1 = local_64 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1cc = -iVar1 / 2 + -1;
        }
        else {
          local_1cc = local_64 / 2;
        }
        local_60 = local_1cc;
      }
      else if (local_180[0].vect[0] == 4) {
        if (local_64 < 0) {
          iVar1 = local_64 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1d0 = -iVar1 / 4 + -1;
        }
        else {
          local_1d0 = local_64 / 4;
        }
        local_60 = local_1d0;
      }
      else {
        if (local_64 < 0) {
          iVar1 = local_64 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1d4 = -iVar1 / local_180[0].vect[0] + -1;
        }
        else {
          local_1d4 = local_64 / local_180[0].vect[0];
        }
        local_60 = local_1d4;
      }
    }
    (in_RDI->smallend).vect[0] = local_60;
    local_70 = (in_RDI->smallend).vect[1];
    local_6c = local_70;
    if (local_180[0].vect[1] != 1) {
      if (local_180[0].vect[1] == 2) {
        if (local_70 < 0) {
          iVar1 = local_70 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1dc = -iVar1 / 2 + -1;
        }
        else {
          local_1dc = local_70 / 2;
        }
        local_6c = local_1dc;
      }
      else if (local_180[0].vect[1] == 4) {
        if (local_70 < 0) {
          iVar1 = local_70 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1e0 = -iVar1 / 4 + -1;
        }
        else {
          local_1e0 = local_70 / 4;
        }
        local_6c = local_1e0;
      }
      else {
        if (local_70 < 0) {
          iVar1 = local_70 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1e4 = -iVar1 / local_180[0].vect[1] + -1;
        }
        else {
          local_1e4 = local_70 / local_180[0].vect[1];
        }
        local_6c = local_1e4;
      }
    }
    (in_RDI->smallend).vect[1] = local_6c;
    local_7c = (in_RDI->smallend).vect[2];
    local_78 = local_7c;
    if (local_180[0].vect[2] != 1) {
      if (local_180[0].vect[2] == 2) {
        if (local_7c < 0) {
          iVar1 = local_7c + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1ec = -iVar1 / 2 + -1;
        }
        else {
          local_1ec = local_7c / 2;
        }
        local_78 = local_1ec;
      }
      else if (local_180[0].vect[2] == 4) {
        if (local_7c < 0) {
          iVar1 = local_7c + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1f0 = -iVar1 / 4 + -1;
        }
        else {
          local_1f0 = local_7c / 4;
        }
        local_78 = local_1f0;
      }
      else {
        if (local_7c < 0) {
          iVar1 = local_7c + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1f4 = -iVar1 / local_180[0].vect[2] + -1;
        }
        else {
          local_1f4 = local_7c / local_180[0].vect[2];
        }
        local_78 = local_1f4;
      }
    }
    (in_RDI->smallend).vect[2] = local_78;
    local_f8 = &in_RDI->btype;
    if (local_f8->itype == 0) {
      local_3c = (in_RDI->bigend).vect[0];
      if (local_180[0].vect[0] != 1) {
        if (local_180[0].vect[0] == 2) {
          if (local_3c < 0) {
            local_3c = local_3c + 1;
            if (local_3c < 1) {
              local_3c = -local_3c;
            }
            local_23c = -local_3c / 2 + -1;
          }
          else {
            local_23c = local_3c / 2;
          }
          local_3c = local_23c;
        }
        else if (local_180[0].vect[0] == 4) {
          if (local_3c < 0) {
            local_3c = local_3c + 1;
            if (local_3c < 1) {
              local_3c = -local_3c;
            }
            local_240 = -local_3c / 4 + -1;
          }
          else {
            local_240 = local_3c / 4;
          }
          local_3c = local_240;
        }
        else {
          if (local_3c < 0) {
            local_3c = local_3c + 1;
            if (local_3c < 1) {
              local_3c = -local_3c;
            }
            local_244 = -local_3c / local_180[0].vect[0] + -1;
          }
          else {
            local_244 = local_3c / local_180[0].vect[0];
          }
          local_3c = local_244;
        }
      }
      (in_RDI->bigend).vect[0] = local_3c;
      local_48 = (in_RDI->bigend).vect[1];
      if (local_180[0].vect[1] != 1) {
        if (local_180[0].vect[1] == 2) {
          if (local_48 < 0) {
            local_48 = local_48 + 1;
            if (local_48 < 1) {
              local_48 = -local_48;
            }
            local_24c = -local_48 / 2 + -1;
          }
          else {
            local_24c = local_48 / 2;
          }
          local_48 = local_24c;
        }
        else if (local_180[0].vect[1] == 4) {
          if (local_48 < 0) {
            local_48 = local_48 + 1;
            if (local_48 < 1) {
              local_48 = -local_48;
            }
            local_250 = -local_48 / 4 + -1;
          }
          else {
            local_250 = local_48 / 4;
          }
          local_48 = local_250;
        }
        else {
          if (local_48 < 0) {
            local_48 = local_48 + 1;
            if (local_48 < 1) {
              local_48 = -local_48;
            }
            local_254 = -local_48 / local_180[0].vect[1] + -1;
          }
          else {
            local_254 = local_48 / local_180[0].vect[1];
          }
          local_48 = local_254;
        }
      }
      (in_RDI->bigend).vect[1] = local_48;
      local_54 = (in_RDI->bigend).vect[2];
      if (local_180[0].vect[2] != 1) {
        if (local_180[0].vect[2] == 2) {
          if (local_54 < 0) {
            local_54 = local_54 + 1;
            if (local_54 < 1) {
              local_54 = -local_54;
            }
            local_25c = -local_54 / 2 + -1;
          }
          else {
            local_25c = local_54 / 2;
          }
          local_54 = local_25c;
        }
        else if (local_180[0].vect[2] == 4) {
          if (local_54 < 0) {
            local_54 = local_54 + 1;
            if (local_54 < 1) {
              local_54 = -local_54;
            }
            local_260 = -local_54 / 4 + -1;
          }
          else {
            local_260 = local_54 / 4;
          }
          local_54 = local_260;
        }
        else {
          if (local_54 < 0) {
            local_54 = local_54 + 1;
            if (local_54 < 1) {
              local_54 = -local_54;
            }
            local_264 = -local_54 / local_180[0].vect[2] + -1;
          }
          else {
            local_264 = local_54 / local_180[0].vect[2];
          }
          local_54 = local_264;
        }
      }
      (in_RDI->bigend).vect[2] = local_54;
    }
    else {
      local_130 = local_158;
      local_108 = local_158;
      IntVect::IntVect(&local_164,0);
      for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
        if ((((in_RDI->btype).itype & 1 << ((byte)local_168 & 0x1f)) != 0) &&
           ((in_RDI->bigend).vect[local_168] % local_158->vect[local_168] != 0)) {
          local_164.vect[local_168] = 1;
        }
      }
      local_18 = (in_RDI->bigend).vect[0];
      local_20c = local_158->vect[0];
      if (local_20c != 1) {
        if (local_20c == 2) {
          if (local_18 < 0) {
            local_18 = local_18 + 1;
            if (local_18 < 1) {
              local_18 = -local_18;
            }
            local_204 = -local_18 / 2 + -1;
          }
          else {
            local_204 = local_18 / 2;
          }
          local_18 = local_204;
        }
        else if (local_20c == 4) {
          if (local_18 < 0) {
            local_18 = local_18 + 1;
            if (local_18 < 1) {
              local_18 = -local_18;
            }
            local_208 = -local_18 / 4 + -1;
          }
          else {
            local_208 = local_18 / 4;
          }
          local_18 = local_208;
        }
        else {
          if (local_18 < 0) {
            local_18 = local_18 + 1;
            if (local_18 < 1) {
              local_18 = -local_18;
            }
            local_20c = -local_18 / local_20c + -1;
          }
          else {
            local_20c = local_18 / local_20c;
          }
          local_18 = local_20c;
        }
      }
      (in_RDI->bigend).vect[0] = local_18;
      local_24 = (in_RDI->bigend).vect[1];
      local_21c = local_158->vect[1];
      if (local_21c != 1) {
        if (local_21c == 2) {
          if (local_24 < 0) {
            local_24 = local_24 + 1;
            if (local_24 < 1) {
              local_24 = -local_24;
            }
            local_214 = -local_24 / 2 + -1;
          }
          else {
            local_214 = local_24 / 2;
          }
          local_24 = local_214;
        }
        else if (local_21c == 4) {
          if (local_24 < 0) {
            local_24 = local_24 + 1;
            if (local_24 < 1) {
              local_24 = -local_24;
            }
            local_218 = -local_24 / 4 + -1;
          }
          else {
            local_218 = local_24 / 4;
          }
          local_24 = local_218;
        }
        else {
          if (local_24 < 0) {
            local_24 = local_24 + 1;
            if (local_24 < 1) {
              local_24 = -local_24;
            }
            local_21c = -local_24 / local_21c + -1;
          }
          else {
            local_21c = local_24 / local_21c;
          }
          local_24 = local_21c;
        }
      }
      (in_RDI->bigend).vect[1] = local_24;
      local_30 = (in_RDI->bigend).vect[2];
      local_22c = local_158->vect[2];
      if (local_22c != 1) {
        if (local_22c == 2) {
          if (local_30 < 0) {
            local_30 = local_30 + 1;
            if (local_30 < 1) {
              local_30 = -local_30;
            }
            local_224 = -local_30 / 2 + -1;
          }
          else {
            local_224 = local_30 / 2;
          }
          local_30 = local_224;
        }
        else if (local_22c == 4) {
          if (local_30 < 0) {
            local_30 = local_30 + 1;
            if (local_30 < 1) {
              local_30 = -local_30;
            }
            local_228 = -local_30 / 4 + -1;
          }
          else {
            local_228 = local_30 / 4;
          }
          local_30 = local_228;
        }
        else {
          if (local_30 < 0) {
            local_30 = local_30 + 1;
            if (local_30 < 1) {
              local_30 = -local_30;
            }
            local_22c = -local_30 / local_22c + -1;
          }
          else {
            local_22c = local_30 / local_22c;
          }
          local_30 = local_22c;
        }
      }
      (in_RDI->bigend).vect[2] = local_30;
      (in_RDI->bigend).vect[0] = local_164.vect[0] + (in_RDI->bigend).vect[0];
      (in_RDI->bigend).vect[1] = local_164.vect[1] + (in_RDI->bigend).vect[1];
      (in_RDI->bigend).vect[2] = local_164.vect[2] + (in_RDI->bigend).vect[2];
    }
  }
  return in_RDI;
}

Assistant:

Box
PCInterp::CoarseBox (const Box& fine,
                     int        ratio)
{
    return amrex::coarsen(fine,ratio);
}